

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O1

void __thiscall leveldb::MemEnvTest_Basics_Test::TestBody(MemEnvTest_Basics_Test *this)

{
  Env *pEVar1;
  pointer pcVar2;
  void *pvVar3;
  undefined8 uVar4;
  int iVar5;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar6;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  AssertionResult *pAVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char *pcVar10;
  char *in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar11;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  SequentialFile *seq_file;
  RandomAccessFile *rand_file;
  uint64_t file_size;
  WritableFile *writable_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  children;
  AssertionResult local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  AssertionResult local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertionResult local_68;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  AssertHelper local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar1 = (this->super_MemEnvTest).env_;
  pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_a0 + 0x10);
  local_a0._0_8_ = pbVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir","");
  (*pEVar1->_vptr_Env[10])(&local_80,pEVar1,(string *)local_a0);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
             (char *)&local_68.message_,(Status *)"env_->CreateDir(\"/dir\")");
  if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
    operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
      pbVar7) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (local_c0.success_ == false) {
    testing::Message::Message((Message *)local_a0);
    if (local_c0.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)
                local_c0.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl)->_M_p;
    }
    iVar5 = 0x1f;
LAB_0010bf96:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,iVar5,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_a0._0_8_;
LAB_0010c032:
    uVar6._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_c0.message_;
    if (pbVar7 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar7 + 8))();
      uVar6._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_c0.message_;
    }
  }
  else {
    if (local_c0.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = ((_Alloc_hider *)
               local_c0.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl)->_M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_c0.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(pcVar2);
      }
      operator_delete((void *)local_c0.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    }
    pEVar1 = (this->super_MemEnvTest).env_;
    local_a0._0_8_ = pbVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/non_existent","");
    iVar5 = (*pEVar1->_vptr_Env[6])(pEVar1,(string *)local_a0);
    local_c0._0_8_ = CONCAT71(local_c0._1_7_,(char)iVar5) ^ 1;
    local_c0.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        pbVar7) {
      operator_delete((void *)local_a0._0_8_);
    }
    uVar6._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_c0.message_;
    if (local_c0.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&local_c0,
                 (AssertionResult *)"!env_->FileExists(\"/dir/non_existent\")","false","true",in_R9)
      ;
      this_00 = &local_68.message_;
      iVar5 = 0x22;
LAB_0010c008:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,iVar5,(char *)local_a0._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_
          != pbVar7) {
        operator_delete((void *)local_a0._0_8_);
      }
      pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(local_80._4_4_,local_80._0_4_);
      goto LAB_0010c032;
    }
    if (local_c0.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = ((_Alloc_hider *)
               local_c0.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl)->_M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_c0.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(pcVar2);
      }
      operator_delete((void *)uVar6._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    }
    pEVar1 = (this->super_MemEnvTest).env_;
    local_a0._0_8_ = pbVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/non_existent","");
    (*pEVar1->_vptr_Env[0xd])(&local_80,pEVar1,(string *)local_a0,&local_68.message_);
    pvVar3 = (void *)CONCAT44(local_80._4_4_,local_80._0_4_);
    local_c0.success_ = pvVar3 != (void *)0x0;
    local_c0.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        pbVar7) {
      operator_delete((void *)local_a0._0_8_);
    }
    uVar6._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_c0.message_;
    if (local_c0.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a0,(internal *)&local_c0,
                 (AssertionResult *)"!env_->GetFileSize(\"/dir/non_existent\", &file_size).ok()",
                 "false","true",in_R9);
      this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58;
      iVar5 = 0x23;
      goto LAB_0010c008;
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined8 **)
              local_c0.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_c0.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(*(undefined8 **)
                         local_c0.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      }
      operator_delete((void *)uVar6._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    }
    pEVar1 = (this->super_MemEnvTest).env_;
    local_a0._0_8_ = pbVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir","");
    (*pEVar1->_vptr_Env[7])(&local_80,pEVar1,(string *)local_a0,&local_48);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
               (char *)&local_58,(Status *)"env_->GetChildren(\"/dir\", &children)");
    if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_ !=
        pbVar7) {
      operator_delete((void *)local_a0._0_8_);
    }
    uVar6._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_c0.message_;
    if (local_c0.success_ == false) {
      testing::Message::Message((Message *)local_a0);
      if (local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((_Alloc_hider *)
                  local_c0.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl)->_M_p;
      }
      iVar5 = 0x24;
      goto LAB_0010bf96;
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined8 **)
              local_c0.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_c0.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(*(undefined8 **)
                         local_c0.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      }
      operator_delete((void *)uVar6._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    }
    local_80.success_ = false;
    local_80._1_3_ = 0;
    local_c0._0_8_ =
         (long)local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_a0,"0","children.size()",(int *)&local_80,
               (unsigned_long *)&local_c0);
    uVar4 = local_a0._8_8_;
    if (local_a0[0] != (string)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(undefined8 **)local_a0._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a0._8_8_ + 0x10)) {
          operator_delete(*(undefined8 **)local_a0._8_8_);
        }
        operator_delete((void *)uVar4);
      }
      pEVar1 = (this->super_MemEnvTest).env_;
      local_a0._0_8_ = pbVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
      (*pEVar1->_vptr_Env[4])(&local_80,pEVar1,(string *)local_a0,&local_58);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                 (char *)&local_70,(Status *)"env_->NewWritableFile(\"/dir/f\", &writable_file)");
      if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
        operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
      }
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._0_8_
          != pbVar7) {
        operator_delete((void *)local_a0._0_8_);
      }
      if (local_c0.success_ == false) {
        testing::Message::Message((Message *)local_a0);
        if (local_c0.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((_Alloc_hider *)
                    local_c0.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl)->_M_p;
        }
        pAVar8 = &local_80;
        iVar5 = 0x28;
LAB_0010c1bf:
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)pAVar8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,iVar5,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)pAVar8,(Message *)local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar8);
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_a0._0_8_;
LAB_0010c1df:
        if (local_70._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
LAB_0010c1ea:
        pAVar8 = &local_c0;
      }
      else {
        testing::AssertionResult::~AssertionResult(&local_c0);
        pEVar1 = (this->super_MemEnvTest).env_;
        local_a0._0_8_ = pbVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
        (*pEVar1->_vptr_Env[0xd])(&local_80,pEVar1,(string *)local_a0,&local_68.message_);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                   (char *)&local_70,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
        if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0._0_8_ != pbVar7) {
          operator_delete((void *)local_a0._0_8_);
        }
        if (local_c0.success_ == false) {
          testing::Message::Message((Message *)local_a0);
          if (local_c0.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((_Alloc_hider *)
                      local_c0.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)->_M_p;
          }
          pAVar8 = &local_80;
          iVar5 = 0x29;
          goto LAB_0010c1bf;
        }
        testing::AssertionResult::~AssertionResult(&local_c0);
        local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a0,"0","file_size",(int *)&local_c0,
                   (unsigned_long *)&local_68.message_);
        if (local_a0[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_c0);
          if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_a0._8_8_ ==
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)local_a0._8_8_;
          }
          pAVar8 = &local_80;
          iVar5 = 0x2a;
          goto LAB_0010c298;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
        if (local_58._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_58._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        pEVar1 = (this->super_MemEnvTest).env_;
        local_a0._0_8_ = pbVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
        iVar5 = (*pEVar1->_vptr_Env[6])(pEVar1,(string *)local_a0);
        local_c0.success_ = (bool)(char)iVar5;
        local_c0.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0._0_8_ != pbVar7) {
          operator_delete((void *)local_a0._0_8_);
        }
        if (local_c0.success_ == false) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)0x1582f3,"false",
                     "true",in_R9);
          iVar5 = 0x2e;
          goto LAB_0010c249;
        }
        testing::AssertionResult::~AssertionResult(&local_c0);
        pEVar1 = (this->super_MemEnvTest).env_;
        local_a0._0_8_ = pbVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
        (*pEVar1->_vptr_Env[0xd])(&local_80,pEVar1,(string *)local_a0,&local_68.message_);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                   (char *)&local_70,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
        if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0._0_8_ != pbVar7) {
          operator_delete((void *)local_a0._0_8_);
        }
        if (local_c0.success_ == false) {
          testing::Message::Message((Message *)local_a0);
          if (local_c0.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)local_c0.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          pAVar8 = &local_80;
          iVar5 = 0x2f;
          goto LAB_0010c1bf;
        }
        testing::AssertionResult::~AssertionResult(&local_c0);
        local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a0,"0","file_size",(int *)&local_c0,
                   (unsigned_long *)&local_68.message_);
        if (local_a0[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_c0);
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_a0._8_8_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)local_a0._8_8_;
          }
          pAVar8 = &local_80;
          iVar5 = 0x30;
          goto LAB_0010c298;
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
        pEVar1 = (this->super_MemEnvTest).env_;
        local_a0._0_8_ = pbVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir","");
        (*pEVar1->_vptr_Env[7])(&local_80,pEVar1,(string *)local_a0,&local_48);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                   (char *)&local_70,(Status *)"env_->GetChildren(\"/dir\", &children)");
        if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
          operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0._0_8_ != pbVar7) {
          operator_delete((void *)local_a0._0_8_);
        }
        if (local_c0.success_ == false) {
          testing::Message::Message((Message *)local_a0);
          if (local_c0.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((_Alloc_hider *)
                      local_c0.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)->_M_p;
          }
          pAVar8 = &local_80;
          iVar5 = 0x31;
          goto LAB_0010c1bf;
        }
        testing::AssertionResult::~AssertionResult(&local_c0);
        local_80.success_ = true;
        local_80._1_3_ = 0;
        local_c0._0_8_ =
             (long)local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_a0,"1","children.size()",(int *)&local_80,
                   (unsigned_long *)&local_c0);
        if (local_a0[0] != (string)0x0) {
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
                    ((internal *)local_a0,"\"f\"","children[0]",(char (*) [2])0x1581d2,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_a0._8_8_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_a0._8_8_;
            }
            pAVar8 = &local_80;
            iVar5 = 0x33;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
          (*pEVar1->_vptr_Env[4])(&local_80,pEVar1,(string *)local_a0,&local_58);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_70,(Status *)"env_->NewWritableFile(\"/dir/f\", &writable_file)"
                    );
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if (local_c0.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((_Alloc_hider *)
                        local_c0.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl)->_M_p;
            }
            pAVar8 = &local_80;
            iVar5 = 0x36;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          local_c0._0_8_ = "abc";
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x3;
          (**(code **)(*(long *)local_58._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x10))
                    (&local_80,
                     local_58._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,&local_c0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_a0,
                     (char *)&local_70,(Status *)"writable_file->Append(\"abc\")");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_a0._8_8_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_a0._8_8_;
            }
            pAVar8 = &local_80;
            iVar5 = 0x37;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          if (local_58._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_58._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
          (*pEVar1->_vptr_Env[5])(&local_80,pEVar1,(string *)local_a0,&local_58);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_70,
                     (Status *)"env_->NewAppendableFile(\"/dir/f\", &writable_file)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_c0.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_c0.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            pAVar8 = &local_80;
            iVar5 = 0x3b;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
          (*pEVar1->_vptr_Env[0xd])(&local_80,pEVar1,(string *)local_a0,&local_68.message_);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_70,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if (local_c0.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_c0.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            pAVar8 = &local_80;
            iVar5 = 0x3c;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          local_c0._0_4_ = 3;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)local_a0,"3","file_size",(int *)&local_c0,
                     (unsigned_long *)&local_68.message_);
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_a0._8_8_ ==
                (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_a0._8_8_;
            }
            pAVar8 = &local_80;
            iVar5 = 0x3d;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          local_c0._0_8_ = "hello";
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x5;
          (**(code **)(*(long *)local_58._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x10))(&local_80);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_a0,
                     (char *)&local_70,(Status *)"writable_file->Append(\"hello\")");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_a0._8_8_)->_M_p;
            }
            pAVar8 = &local_80;
            iVar5 = 0x3e;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          if (local_58._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_58._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
          (*pEVar1->_vptr_Env[0xd])(&local_80,pEVar1,(string *)local_a0,&local_68.message_);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_70,(Status *)"env_->GetFileSize(\"/dir/f\", &file_size)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_c0.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_c0.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            pAVar8 = &local_80;
            iVar5 = 0x42;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          local_c0._0_4_ = 8;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)local_a0,"8","file_size",(int *)&local_c0,
                     (unsigned_long *)&local_68.message_);
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_a0._8_8_;
            }
            pAVar8 = &local_80;
            iVar5 = 0x43;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/non_existent","")
          ;
          local_c0._0_8_ = local_b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/dir/g","");
          (*pEVar1->_vptr_Env[0xe])(&local_70,pEVar1,(string *)local_a0,&local_c0);
          local_80.success_ =
               local_70._M_head_impl !=
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_80.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__(local_70._M_head_impl);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_c0._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0) {
            operator_delete((void *)local_c0._0_8_);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_80.success_ == false) {
            testing::Message::Message((Message *)&local_c0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_80,
                       (AssertionResult *)
                       "!env_->RenameFile(\"/dir/non_existent\", \"/dir/g\").ok()","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,0x46,(char *)local_a0._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_70,(Message *)&local_c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
            pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c0._0_8_;
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_a0._0_8_ != pbVar7) {
              operator_delete((void *)local_a0._0_8_);
              pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c0._0_8_;
            }
LAB_0010c727:
            if (pbVar9 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
              (**(code **)(*(long *)pbVar9 + 8))();
            }
            pAVar8 = &local_80;
            goto LAB_0010c1ef;
          }
          testing::AssertionResult::~AssertionResult(&local_80);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
          local_c0._0_8_ = local_b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/dir/g","");
          (*pEVar1->_vptr_Env[0xe])(&local_70,pEVar1,(string *)local_a0,&local_c0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_80,
                     &local_68.success_,(Status *)"env_->RenameFile(\"/dir/f\", \"/dir/g\")");
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__(local_70._M_head_impl);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_c0._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0) {
            operator_delete((void *)local_c0._0_8_);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_80.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if (local_80.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((_Alloc_hider *)
                        local_80.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,0x47,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_c0,(Message *)local_a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
            pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a0._0_8_;
            goto LAB_0010c727;
          }
          testing::AssertionResult::~AssertionResult(&local_80);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/f","");
          iVar5 = (*pEVar1->_vptr_Env[6])(pEVar1,(string *)local_a0);
          local_c0._0_8_ = CONCAT71(local_c0._1_7_,(char)iVar5) ^ 1;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,
                       (AssertionResult *)"!env_->FileExists(\"/dir/f\")","false","true",in_R9);
            iVar5 = 0x48;
LAB_0010c249:
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,iVar5,(char *)local_a0._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_70,(Message *)&local_80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_a0._0_8_ != pbVar7) {
              operator_delete((void *)local_a0._0_8_);
            }
            local_70._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_80._4_4_,local_80._0_4_);
            goto LAB_0010c1df;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/g","");
          iVar5 = (*pEVar1->_vptr_Env[6])(pEVar1,(string *)local_a0);
          local_c0.success_ = (bool)(char)iVar5;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)0x158412,"false",
                       "true",in_R9);
            iVar5 = 0x49;
            goto LAB_0010c249;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/g","");
          (*pEVar1->_vptr_Env[0xd])(&local_80,pEVar1,(string *)local_a0,&local_68.message_);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_70,(Status *)"env_->GetFileSize(\"/dir/g\", &file_size)");
          if ((void *)CONCAT44(local_80._4_4_,local_80._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if (local_c0.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_c0.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            pAVar8 = &local_80;
            iVar5 = 0x4a;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          local_c0._0_4_ = 8;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)local_a0,"8","file_size",(int *)&local_c0,
                     (unsigned_long *)&local_68.message_);
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_a0._8_8_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_a0._8_8_;
            }
            pAVar8 = &local_80;
            iVar5 = 0x4b;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/non_existent","")
          ;
          (*pEVar1->_vptr_Env[2])(&local_70,pEVar1,(string *)local_a0,&local_80);
          local_c0.success_ =
               local_70._M_head_impl !=
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__(local_70._M_head_impl);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,
                       (AssertionResult *)
                       "!env_->NewSequentialFile(\"/dir/non_existent\", &seq_file).ok()","false",
                       "true",in_R9);
            iVar5 = 0x50;
LAB_0010c83f:
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,iVar5,(char *)local_a0._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_68,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_a0._0_8_ != pbVar7) {
              operator_delete((void *)local_a0._0_8_);
            }
            goto LAB_0010c1df;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          bVar11 = CONCAT44(local_80._4_4_,local_80._0_4_) == 0;
          local_c0.success_ = bVar11;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!bVar11) {
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"!seq_file",
                       "false","true",in_R9);
            iVar5 = 0x51;
            goto LAB_0010c83f;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/non_existent","")
          ;
          (*pEVar1->_vptr_Env[3])(&local_68,pEVar1,(string *)local_a0,&local_70);
          pvVar3 = (void *)CONCAT44(local_68._4_4_,local_68._0_4_);
          local_c0.success_ = pvVar3 != (void *)0x0;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,
                       (AssertionResult *)
                       "!env_->NewRandomAccessFile(\"/dir/non_existent\", &rand_file).ok()","false",
                       "true",in_R9);
            iVar5 = 0x52;
LAB_0010c9d3:
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                       ,iVar5,(char *)local_a0._0_8_);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_a0._0_8_ != pbVar7) {
              operator_delete((void *)local_a0._0_8_);
            }
            local_70._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_68._4_4_,local_68._0_4_);
            goto LAB_0010c1df;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          local_c0.success_ =
               local_70._M_head_impl ==
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,(AssertionResult *)"!rand_file",
                       "false","true",in_R9);
            iVar5 = 0x53;
            goto LAB_0010c9d3;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/non_existent","")
          ;
          (*pEVar1->_vptr_Env[8])(&local_68,pEVar1,(string *)local_a0);
          pvVar3 = (void *)CONCAT44(local_68._4_4_,local_68._0_4_);
          local_c0.success_ = pvVar3 != (void *)0x0;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,
                       (AssertionResult *)"!env_->RemoveFile(\"/dir/non_existent\").ok()","false",
                       "true",in_R9);
            iVar5 = 0x56;
            goto LAB_0010c9d3;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/g","");
          (*pEVar1->_vptr_Env[8])(&local_68,pEVar1,(string *)local_a0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_50,(Status *)"env_->RemoveFile(\"/dir/g\")");
          if ((void *)CONCAT44(local_68._4_4_,local_68._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_68._4_4_,local_68._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_c0.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((_Alloc_hider *)
                        local_c0.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl)->_M_p;
            }
            pAVar8 = &local_68;
            iVar5 = 0x57;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir/g","");
          iVar5 = (*pEVar1->_vptr_Env[6])(pEVar1,(string *)local_a0);
          local_c0._0_8_ = CONCAT71(local_c0._1_7_,(char)iVar5) ^ 1;
          local_c0.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_c0,
                       (AssertionResult *)"!env_->FileExists(\"/dir/g\")","false","true",in_R9);
            iVar5 = 0x58;
            goto LAB_0010c9d3;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir","");
          (*pEVar1->_vptr_Env[7])(&local_68,pEVar1,(string *)local_a0,&local_48);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_50,(Status *)"env_->GetChildren(\"/dir\", &children)");
          if ((void *)CONCAT44(local_68._4_4_,local_68._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_68._4_4_,local_68._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if (local_c0.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_c0.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            pAVar8 = &local_68;
            iVar5 = 0x59;
            goto LAB_0010c1bf;
          }
          testing::AssertionResult::~AssertionResult(&local_c0);
          local_68.success_ = false;
          local_68._1_3_ = 0;
          local_c0._0_8_ =
               (long)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)local_a0,"0","children.size()",(int *)&local_68,
                     (unsigned_long *)&local_c0);
          if (local_a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_c0);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_a0._8_8_)->_M_p;
            }
            pAVar8 = &local_68;
            iVar5 = 0x5a;
            goto LAB_0010c298;
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
          pEVar1 = (this->super_MemEnvTest).env_;
          local_a0._0_8_ = pbVar7;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"/dir","");
          (*pEVar1->_vptr_Env[0xb])(&local_68,pEVar1,(string *)local_a0);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,
                     (char *)&local_50,(Status *)"env_->RemoveDir(\"/dir\")");
          if ((void *)CONCAT44(local_68._4_4_,local_68._0_4_) != (void *)0x0) {
            operator_delete__((void *)CONCAT44(local_68._4_4_,local_68._0_4_));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_a0._0_8_ != pbVar7) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (local_c0.success_ == false) {
            testing::Message::Message((Message *)local_a0);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_c0.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)local_c0.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            pAVar8 = &local_68;
            iVar5 = 0x5b;
            goto LAB_0010c1bf;
          }
          goto LAB_0010c1ea;
        }
        testing::Message::Message((Message *)&local_c0);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_a0._8_8_ ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)local_a0._8_8_;
        }
        pAVar8 = &local_80;
        iVar5 = 0x32;
LAB_0010c298:
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)pAVar8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                   ,iVar5,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)pAVar8,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar8);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c0._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_c0._0_8_ + 8))();
        }
        pAVar8 = (AssertionResult *)local_a0;
      }
LAB_0010c1ef:
      testing::AssertionResult::~AssertionResult(pAVar8);
      goto LAB_0010c060;
    }
    testing::Message::Message((Message *)&local_c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_a0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0x25,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    uVar6._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_a0._8_8_;
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._0_8_ + 8))();
      uVar6._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_a0._8_8_;
    }
  }
  if (uVar6._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)
            uVar6._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)uVar6._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)
                       uVar6._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    }
    operator_delete((void *)uVar6._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
LAB_0010c060:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

TEST_F(MemEnvTest, Basics) {
  uint64_t file_size;
  WritableFile* writable_file;
  std::vector<std::string> children;

  ASSERT_LEVELDB_OK(env_->CreateDir("/dir"));

  // Check that the directory is empty.
  ASSERT_TRUE(!env_->FileExists("/dir/non_existent"));
  ASSERT_TRUE(!env_->GetFileSize("/dir/non_existent", &file_size).ok());
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(0, children.size());

  // Create a file.
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(0, file_size);
  delete writable_file;

  // Check that the file exists.
  ASSERT_TRUE(env_->FileExists("/dir/f"));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(0, file_size);
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(1, children.size());
  ASSERT_EQ("f", children[0]);

  // Write to the file.
  ASSERT_LEVELDB_OK(env_->NewWritableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(writable_file->Append("abc"));
  delete writable_file;

  // Check that append works.
  ASSERT_LEVELDB_OK(env_->NewAppendableFile("/dir/f", &writable_file));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(3, file_size);
  ASSERT_LEVELDB_OK(writable_file->Append("hello"));
  delete writable_file;

  // Check for expected size.
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/f", &file_size));
  ASSERT_EQ(8, file_size);

  // Check that renaming works.
  ASSERT_TRUE(!env_->RenameFile("/dir/non_existent", "/dir/g").ok());
  ASSERT_LEVELDB_OK(env_->RenameFile("/dir/f", "/dir/g"));
  ASSERT_TRUE(!env_->FileExists("/dir/f"));
  ASSERT_TRUE(env_->FileExists("/dir/g"));
  ASSERT_LEVELDB_OK(env_->GetFileSize("/dir/g", &file_size));
  ASSERT_EQ(8, file_size);

  // Check that opening non-existent file fails.
  SequentialFile* seq_file;
  RandomAccessFile* rand_file;
  ASSERT_TRUE(!env_->NewSequentialFile("/dir/non_existent", &seq_file).ok());
  ASSERT_TRUE(!seq_file);
  ASSERT_TRUE(!env_->NewRandomAccessFile("/dir/non_existent", &rand_file).ok());
  ASSERT_TRUE(!rand_file);

  // Check that deleting works.
  ASSERT_TRUE(!env_->RemoveFile("/dir/non_existent").ok());
  ASSERT_LEVELDB_OK(env_->RemoveFile("/dir/g"));
  ASSERT_TRUE(!env_->FileExists("/dir/g"));
  ASSERT_LEVELDB_OK(env_->GetChildren("/dir", &children));
  ASSERT_EQ(0, children.size());
  ASSERT_LEVELDB_OK(env_->RemoveDir("/dir"));
}